

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_logging.c
# Opt level: O0

int oonf_log_register_source(char *name)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t len;
  size_t i;
  char *name_local;
  
  len = 0;
  while( true ) {
    name_local._4_4_ = (int)len;
    if (_source_count <= len) {
      if (len == 0x80) {
        if ((log_global_mask[2] & 4) != 0) {
          oonf_log(LOG_SEVERITY_WARN,LOG_LOGGING,"src/libcore/oonf_logging.c",0xd5,(void *)0x0,0,
                   "Maximum number of logging sources reached, cannot allocate %s",name);
        }
        name_local._4_4_ = 1;
      }
      else {
        pcVar2 = strdup(name);
        LOG_SOURCE_NAMES[len] = pcVar2;
        if (pcVar2 == (char *)0x0) {
          if ((log_global_mask[2] & 4) != 0) {
            oonf_log(LOG_SEVERITY_WARN,LOG_LOGGING,"src/libcore/oonf_logging.c",0xda,(void *)0x0,0,
                     "Not enough memory for duplicating source name %s",name);
          }
          name_local._4_4_ = 1;
        }
        else {
          _source_count = _source_count + 1;
          sVar3 = strlen(name);
          if (_max_sourcetext_len < sVar3) {
            _max_sourcetext_len = sVar3;
          }
        }
      }
      return name_local._4_4_;
    }
    iVar1 = strcmp(name,LOG_SOURCE_NAMES[len]);
    if (iVar1 == 0) break;
    len = len + 1;
  }
  return name_local._4_4_;
}

Assistant:

int
oonf_log_register_source(const char *name) {
  size_t i, len;

  /* maybe the source is already there ? */
  for (i = 0; i < _source_count; i++) {
    if (strcmp(name, LOG_SOURCE_NAMES[i]) == 0) {
      return i;
    }
  }

  if (i == LOG_MAXIMUM_SOURCES) {
    OONF_WARN(LOG_LOGGING,
      "Maximum number of logging sources reached,"
      " cannot allocate %s",
      name);
    return LOG_MAIN;
  }

  if ((LOG_SOURCE_NAMES[i] = strdup(name)) == NULL) {
    OONF_WARN(LOG_LOGGING, "Not enough memory for duplicating source name %s", name);
    return LOG_MAIN;
  }

  _source_count++;
  len = strlen(name);
  if (len > _max_sourcetext_len) {
    _max_sourcetext_len = len;
  }
  return i;
}